

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node_effects.cpp
# Opt level: O3

void __thiscall
PixelDist_GradApply4Radial::getPixel
          (PixelDist_GradApply4Radial *this,uchar *data,Pixel *p,int x,int y)

{
  byte bVar1;
  undefined2 uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ImageData *this_00;
  uchar *puVar6;
  int x_00;
  float fVar7;
  float fVar8;
  float fVar9;
  
  iVar5 = (int)((*(float *)data + this->radOuter) * this->distScale);
  iVar3 = (this->grad).image.w;
  x_00 = iVar3 + -1;
  if (iVar5 < iVar3) {
    x_00 = iVar5;
  }
  if (x_00 < 1) {
    x_00 = 0;
  }
  this_00 = asImage(&(this->grad).image);
  puVar6 = fe::ImageData::getPixelPtr(this_00,x_00,0);
  uVar2 = *(undefined2 *)(puVar6 + 1);
  bVar1 = puVar6[3];
  fVar7 = this->radSharpOuter + *(float *)data;
  fVar8 = 0.0;
  if (0.0 <= fVar7) {
    fVar8 = fVar7;
  }
  fVar7 = 1.0;
  if (fVar8 <= 1.0) {
    fVar7 = fVar8;
  }
  fVar9 = this->radSharpInner - *(float *)data;
  fVar8 = 0.0;
  if (0.0 <= fVar9) {
    fVar8 = fVar9;
  }
  fVar9 = 1.0;
  if (fVar8 <= 1.0) {
    fVar9 = fVar8;
  }
  (p->field_0).field_0.bytes[0] = *puVar6;
  *(undefined2 *)((long)&p->field_0 + 1) = uVar2;
  lVar4 = (long)(int)((int)(fVar9 * 255.0) * (int)(fVar7 * 255.0) * (uint)bVar1) * 0x81018203;
  (p->field_0).field_0.bytes[3] = (char)(uint)((ulong)lVar4 >> 0x2f) - (char)(lVar4 >> 0x3f);
  return;
}

Assistant:

void getPixel(GET_PIXEL_ARGS) const
    {
        PixelR8G8B8A8 gp;
        Pixel g;

        const fe_image& image = grad.image;

        const PixDist* pp = (PixDist*)data;

        int gx = int((pp->d1 + radOuter) * distScale);
        if (gx >= image.w)
            gx = image.w - 1;
        if (gx < 0)
            gx = 0;

        gp.getPixel(asImage(&image)->getPixelPtr(gx, 0), g, OPERATOR_ARGS_PASS);
        int a1 = getAlphaRadOpt(-pp->d1, radSharpOuter, 1.0f);
        int a2 = getAlphaRadOpt(pp->d1, radSharpInner, 1.0f);

        p.r = g.r;
        p.g = g.g;
        p.b = g.b;

        p.a = g.a * a1  * a2 / 255 / 255;
    }